

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O3

bool __thiscall S2Cell::UEdgeIsClosest(S2Cell *this,S2Point *p,int v_end)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = (this->uv_).bounds_[0].bounds_.c_[0];
  dVar2 = (this->uv_).bounds_[0].bounds_.c_[1];
  dVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)((this->uv_).bounds_ + 1),v_end);
  dVar5 = (dVar4 * dVar4 + 1.0) * p->c_[0] + 0.0;
  if (dVar5 - dVar4 * dVar1 * p->c_[1] <= dVar1 * p->c_[2]) {
    bVar3 = false;
  }
  else {
    bVar3 = dVar5 - dVar4 * dVar2 * p->c_[1] < p->c_[2] * dVar2;
  }
  return bVar3;
}

Assistant:

bool S2Cell::UEdgeIsClosest(const S2Point& p, int v_end) const {
  double u0 = uv_[0][0], u1 = uv_[0][1], v = uv_[1][v_end];
  // These are the normals to the planes that are perpendicular to the edge
  // and pass through one of its two endpoints.
  S2Point dir0(v * v + 1, -u0 * v, -u0);
  S2Point dir1(v * v + 1, -u1 * v, -u1);
  return p.DotProd(dir0) > 0 && p.DotProd(dir1) < 0;
}